

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * hdr_load_rgbe(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  stbi_uc *__ptr;
  stbi_uc *psVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  stbi_uc *psVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char buffer [1024];
  char *local_440;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  hdr_gettoken(s,&local_438);
  if (CONCAT17(cStack_42e,
               CONCAT16(cStack_42f,
                        CONCAT15(cStack_430,
                                 CONCAT14(cStack_431,
                                          CONCAT13(cStack_432,
                                                   CONCAT12(cStack_433,
                                                            CONCAT11(cStack_434,cStack_435))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_431,
               CONCAT16(cStack_432,
                        CONCAT15(cStack_433,
                                 CONCAT14(cStack_434,
                                          CONCAT13(cStack_435,
                                                   CONCAT12(cStack_436,
                                                            CONCAT11(cStack_437,local_438))))))) ==
      0x4e41494441523f23) {
    hdr_gettoken(s,&local_438);
    pcVar12 = "Unsupported HDR format";
    if (local_438 != '\0') {
      bVar1 = false;
      do {
        auVar15[0] = -(cStack_431 == '3');
        auVar15[1] = -(cStack_430 == '2');
        auVar15[2] = -(cStack_42f == '-');
        auVar15[3] = -(cStack_42e == 'b');
        auVar15[4] = -(cStack_42d == 'i');
        auVar15[5] = -(cStack_42c == 't');
        auVar15[6] = -(cStack_42b == '_');
        auVar15[7] = -(cStack_42a == 'r');
        auVar15[8] = -(cStack_429 == 'l');
        auVar15[9] = -(cStack_428 == 'e');
        auVar15[10] = -(cStack_427 == '_');
        auVar15[0xb] = -(cStack_426 == 'r');
        auVar15[0xc] = -(cStack_425 == 'g');
        auVar15[0xd] = -(cStack_424 == 'b');
        auVar15[0xe] = -(cStack_423 == 'e');
        auVar15[0xf] = -(cStack_422 == '\0');
        auVar16[0] = -(local_438 == 'F');
        auVar16[1] = -(cStack_437 == 'O');
        auVar16[2] = -(cStack_436 == 'R');
        auVar16[3] = -(cStack_435 == 'M');
        auVar16[4] = -(cStack_434 == 'A');
        auVar16[5] = -(cStack_433 == 'T');
        auVar16[6] = -(cStack_432 == '=');
        auVar16[7] = -(cStack_431 == '3');
        auVar16[8] = -(cStack_430 == '2');
        auVar16[9] = -(cStack_42f == '-');
        auVar16[10] = -(cStack_42e == 'b');
        auVar16[0xb] = -(cStack_42d == 'i');
        auVar16[0xc] = -(cStack_42c == 't');
        auVar16[0xd] = -(cStack_42b == '_');
        auVar16[0xe] = -(cStack_42a == 'r');
        auVar16[0xf] = -(cStack_429 == 'l');
        auVar16 = auVar16 & auVar15;
        if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if ((bVar1) &&
         (hdr_gettoken(s,&local_438), cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d)
         ) {
        local_440 = &cStack_435;
        lVar7 = strtol(local_440,&local_440,10);
        local_440 = local_440 + 2;
        do {
          pcVar10 = local_440;
          local_440 = pcVar10 + 1;
        } while (pcVar10[-2] == ' ');
        if (((pcVar10[-2] == '+') && (pcVar10[-1] == 'X')) && (*pcVar10 == ' ')) {
          iVar6 = 0;
          lVar8 = strtol(local_440,(char **)0x0,10);
          uVar11 = (uint)lVar8;
          *x = uVar11;
          iVar14 = (int)lVar7;
          *y = iVar14;
          *comp = 4;
          __ptr = (stbi_uc *)malloc((long)(int)(iVar14 * uVar11 * 4));
          psVar13 = __ptr;
          if (uVar11 - 0x8000 < 0xffff8008) goto LAB_00159cb1;
          if (iVar14 < 1) {
            return __ptr;
          }
          iVar6 = 0;
          while( true ) {
            iVar2 = get8(s);
            iVar3 = get8(s);
            uVar4 = get8(s);
            if (((iVar2 != 2) || (iVar3 != 2)) || ((uVar4 & 0x80) != 0)) {
              *psVar13 = (stbi_uc)iVar2;
              psVar13[1] = (stbi_uc)iVar3;
              psVar13[2] = (stbi_uc)uVar4;
              iVar6 = get8(s);
              psVar13[3] = (stbi_uc)iVar6;
              psVar13 = psVar13 + 4;
              iVar6 = 0;
              iVar2 = 1;
              do {
                if ((FILE *)s->img_file == (FILE *)0x0) {
                  *(undefined4 *)psVar13 = *(undefined4 *)s->img_buffer;
                  s->img_buffer = s->img_buffer + 4;
                }
                else {
                  fread(psVar13,1,4,(FILE *)s->img_file);
                }
                psVar13 = psVar13 + 4;
                iVar2 = iVar2 + 1;
                while ((int)uVar11 <= iVar2) {
                  iVar6 = iVar6 + 1;
LAB_00159cb1:
                  iVar2 = 0;
                  if (iVar14 <= iVar6) {
                    return __ptr;
                  }
                }
              } while( true );
            }
            uVar5 = get8(s);
            if ((uVar5 | uVar4 << 8) != uVar11) break;
            lVar7 = 0;
            psVar9 = psVar13;
            do {
              iVar2 = 0;
              do {
                uVar4 = get8(s);
                uVar5 = uVar4 & 0xff;
                if (uVar5 < 0x81) {
                  if (uVar5 != 0) {
                    lVar8 = 0;
                    do {
                      iVar3 = get8(s);
                      psVar9[lVar8 * 4 + (long)iVar2 * 4] = (stbi_uc)iVar3;
                      lVar8 = lVar8 + 1;
                    } while ((uVar4 & 0xff) != (uint)lVar8);
                    iVar2 = iVar2 + (uint)lVar8;
                  }
                }
                else {
                  iVar3 = get8(s);
                  lVar8 = 0;
                  do {
                    psVar9[lVar8 * 4 + (long)iVar2 * 4] = (stbi_uc)iVar3;
                    lVar8 = lVar8 + 1;
                  } while ((uVar5 ^ (uint)lVar8) != 0x80);
                  iVar2 = iVar2 + (uint)lVar8;
                }
              } while (iVar2 < (int)uVar11);
              lVar7 = lVar7 + 1;
              psVar9 = psVar9 + 1;
            } while (lVar7 != 4);
            psVar13 = psVar13 + (uVar11 << 2);
            iVar6 = iVar6 + 1;
            if (iVar6 == iVar14) {
              return __ptr;
            }
          }
          free(__ptr);
          pcVar12 = "corrupt HDR";
        }
      }
    }
  }
  else {
    pcVar12 = "Corrupt HDR image";
  }
  failure_reason = pcVar12;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *hdr_load_rgbe(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	stbi_uc *rgbe_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epuc("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epuc("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epuc("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epuc("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

	// RGBE _MUST_ come out as 4 components
   *comp = 4;
	req_comp = 4;

	// Read data
	rgbe_data = (stbi_uc *) malloc(height * width * req_comp * sizeof(stbi_uc));
	//	point to the beginning
	scanline = rgbe_data;

	// Load image data
   // image data is stored as some number of scan lines
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
           main_decode_loop:
            //getn(rgbe, 4);
            getn(s,scanline, 4);
			scanline += 4;
         }
      }
	} else {
		// Read RLE-encoded data
		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            scanline[0] = c1;
            scanline[1] = c2;
            scanline[2] = len;
            scanline[3] = get8(s);
            scanline += 4;
            i = 1;
            j = 0;
            goto main_decode_loop; // yes, this is insane; blame the insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(rgbe_data); return epuc("invalid decoded scanline length", "corrupt HDR"); }
			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
			//	move the scanline on
			scanline += 4 * width;
		}
	}

   return rgbe_data;
}